

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3BeginTrigger(Parse *pParse,Token *pName1,Token *pName2,int tr_tm,int op,IdList *pColumns
                        ,SrcList *pTableName,Expr *pWhen,int isTemp,int noErr)

{
  undefined1 *puVar1;
  byte bVar2;
  uchar uVar3;
  sqlite3 *db;
  Db *pDVar4;
  Schema *pSVar5;
  char *zArg3;
  Token *pName_00;
  uint uVar6;
  int iVar7;
  int iVar8;
  Table *pTVar9;
  char *pcVar10;
  HashElem *pHVar11;
  Trigger *pTrigger;
  RenameToken *pRVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  Schema **ppSVar16;
  uchar uVar17;
  char *zArg3_00;
  Token *pName;
  DbFixer sFix;
  Expr *local_b0;
  Token *local_68;
  DbFixer local_60;
  
  local_b0 = pWhen;
  db = pParse->db;
  if (isTemp == 0) {
    uVar6 = sqlite3TwoPartName(pParse,pName1,pName2,&local_68);
    uVar15 = (ulong)uVar6;
    if (pTableName != (SrcList *)0x0 && -1 < (int)uVar6) {
LAB_00191073:
      if (db->mallocFailed == '\0') {
        if (((int)uVar15 != 1) && ((db->init).busy != '\0')) {
          pcVar10 = pTableName->a[0].zDatabase;
          if (pcVar10 != (char *)0x0) {
            sqlite3DbFreeNN(db,pcVar10);
          }
          pTableName->a[0].zDatabase = (char *)0x0;
        }
        pTVar9 = sqlite3SrcListLookup(pParse,pTableName);
        pName_00 = local_68;
        if ((((db->init).busy == '\0') && (pTVar9 != (Table *)0x0 && pName2->n == 0)) &&
           (pTVar9->pSchema == db->aDb[1].pSchema)) {
          uVar15 = 1;
        }
        if (db->mallocFailed == '\0') {
          pDVar4 = pParse->db->aDb;
          local_60.zDb = pDVar4[uVar15].zDbSName;
          local_60.pSchema = pDVar4[uVar15].pSchema;
          local_60.zType = "trigger";
          local_60.pName = local_68;
          local_60.bVarOnly = (int)((int)uVar15 == 1);
          local_60.pParse = pParse;
          iVar7 = sqlite3FixSrcList(&local_60,pTableName);
          if (iVar7 == 0) {
            pTVar9 = sqlite3SrcListLookup(pParse,pTableName);
            if (pTVar9 == (Table *)0x0) {
              if ((db->init).iDb == '\x01') {
                puVar1 = &(db->init).field_0x6;
                *puVar1 = *puVar1 | 1;
              }
              pTrigger = (Trigger *)0x0;
              goto LAB_00191103;
            }
            if (pTVar9->nModuleArg == 0) {
              pcVar10 = sqlite3NameFromToken(db,pName_00);
              if (pcVar10 != (char *)0x0) {
                iVar7 = sqlite3CheckObjectName(pParse,pcVar10);
                if (iVar7 == 0) {
                  bVar2 = pParse->eParseMode;
                  if ((bVar2 < 2) &&
                     (pHVar11 = findElementWithHash(&(db->aDb[uVar15].pSchema)->trigHash,pcVar10,
                                                    (uint *)0x0), pHVar11->data != (void *)0x0)) {
                    if (noErr == 0) {
                      sqlite3ErrorMsg(pParse,"trigger %T already exists",pName_00);
                    }
                    else {
                      sqlite3CodeVerifySchema(pParse,(int)uVar15);
                    }
                  }
                  else {
                    pcVar14 = pTVar9->zName;
                    if (pcVar14 == (char *)0x0) {
LAB_0019130c:
                      if (tr_tm == 0x41 || pTVar9->pSelect == (Select *)0x0) {
                        if (tr_tm == 0x41 && pTVar9->pSelect == (Select *)0x0) {
                          sqlite3ErrorMsg(pParse,"cannot create INSTEAD OF trigger on table: %S",
                                          pTableName,0);
                        }
                        else if (bVar2 < 2) {
                          pDVar4 = db->aDb;
                          if (pTVar9->pSchema == (Schema *)0x0) {
                            iVar7 = -1000000;
                          }
                          else {
                            iVar7 = -1;
                            ppSVar16 = &pDVar4->pSchema;
                            do {
                              iVar7 = iVar7 + 1;
                              pSVar5 = *ppSVar16;
                              ppSVar16 = ppSVar16 + 4;
                            } while (pSVar5 != pTVar9->pSchema);
                          }
                          zArg3 = pDVar4[iVar7].zDbSName;
                          zArg3_00 = zArg3;
                          if (isTemp != 0) {
                            zArg3_00 = pDVar4[1].zDbSName;
                          }
                          iVar8 = 5;
                          if (isTemp == 0) {
                            iVar8 = (iVar7 != 1) + 5 + (uint)(iVar7 != 1);
                          }
                          iVar8 = sqlite3AuthCheck(pParse,iVar8,pcVar10,pcVar14,zArg3_00);
                          if (iVar8 == 0) {
                            pcVar14 = "sqlite_master";
                            if (iVar7 == 1) {
                              pcVar14 = "sqlite_temp_master";
                            }
                            iVar7 = sqlite3AuthCheck(pParse,0x12,pcVar14,(char *)0x0,zArg3);
                            if (iVar7 == 0) goto LAB_001913be;
                          }
                        }
                        else {
LAB_001913be:
                          pTrigger = (Trigger *)sqlite3DbMallocZero(db,0x48);
                          if (pTrigger != (Trigger *)0x0) {
                            pTrigger->zName = pcVar10;
                            pcVar10 = sqlite3DbStrDup(db,pTableName->a[0].zName);
                            pTrigger->table = pcVar10;
                            pTrigger->pSchema = db->aDb[uVar15].pSchema;
                            pTrigger->pTabSchema = pTVar9->pSchema;
                            pTrigger->op = (u8)op;
                            pTrigger->tr_tm = '\x02' - ((tr_tm - 0x21U & 0xffffffdf) == 0);
                            if (pParse->eParseMode < 2) {
                              if (pWhen == (Expr *)0x0) {
                                pWhen = (Expr *)0x0;
                              }
                              else {
                                pWhen = exprDup(db,pWhen,1,(u8 **)0x0);
                              }
                            }
                            else {
                              pRVar12 = pParse->pRename;
                              if (pRVar12 != (RenameToken *)0x0) {
                                do {
                                  if ((char *)pRVar12->p == pTableName->a[0].zName) {
                                    pRVar12->p = pcVar10;
                                    break;
                                  }
                                  pRVar12 = pRVar12->pNext;
                                } while (pRVar12 != (RenameToken *)0x0);
                              }
                              local_b0 = (Expr *)0x0;
                            }
                            pTrigger->pWhen = pWhen;
                            pTrigger->pColumns = pColumns;
                            pParse->pNewTrigger = pTrigger;
                            pColumns = (IdList *)0x0;
                            pWhen = local_b0;
                            goto LAB_00191103;
                          }
                        }
                      }
                      else {
                        pcVar14 = "AFTER";
                        if (tr_tm == 0x21) {
                          pcVar14 = "BEFORE";
                        }
                        sqlite3ErrorMsg(pParse,"cannot create %s trigger on view: %S",pcVar14,
                                        pTableName,0);
                      }
                    }
                    else {
                      lVar13 = 0;
                      do {
                        if ((ulong)(byte)pcVar14[lVar13] == 0) {
                          uVar3 = ""[(byte)"sqlite_"[lVar13]];
                          uVar17 = '\0';
LAB_001912ee:
                          if (uVar17 != uVar3) goto LAB_0019130c;
                          break;
                        }
                        uVar17 = ""[(byte)pcVar14[lVar13]];
                        uVar3 = ""[(byte)"sqlite_"[lVar13]];
                        if (uVar17 != uVar3) goto LAB_001912ee;
                        lVar13 = lVar13 + 1;
                      } while (lVar13 != 7);
                      sqlite3ErrorMsg(pParse,"cannot create trigger on system table");
                    }
                  }
                }
                sqlite3DbFreeNN(db,pcVar10);
              }
            }
            else {
              sqlite3ErrorMsg(pParse,"cannot create triggers on virtual tables");
            }
          }
          pTrigger = (Trigger *)0x0;
          goto LAB_00191103;
        }
      }
    }
  }
  else if (pName2->n == 0) {
    uVar15 = 1;
    local_68 = pName1;
    if (pTableName != (SrcList *)0x0) goto LAB_00191073;
  }
  else {
    sqlite3ErrorMsg(pParse,"temporary trigger may not have qualified name");
  }
  pTrigger = (Trigger *)0x0;
LAB_00191103:
  sqlite3SrcListDelete(db,pTableName);
  sqlite3IdListDelete(db,pColumns);
  if (pWhen != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pWhen);
  }
  if (pParse->pNewTrigger == (Trigger *)0x0) {
    sqlite3DeleteTrigger(db,pTrigger);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BeginTrigger(
  Parse *pParse,      /* The parse context of the CREATE TRIGGER statement */
  Token *pName1,      /* The name of the trigger */
  Token *pName2,      /* The name of the trigger */
  int tr_tm,          /* One of TK_BEFORE, TK_AFTER, TK_INSTEAD */
  int op,             /* One of TK_INSERT, TK_UPDATE, TK_DELETE */
  IdList *pColumns,   /* column list if this is an UPDATE OF trigger */
  SrcList *pTableName,/* The name of the table/view the trigger applies to */
  Expr *pWhen,        /* WHEN clause */
  int isTemp,         /* True if the TEMPORARY keyword is present */
  int noErr           /* Suppress errors if the trigger already exists */
){
  Trigger *pTrigger = 0;  /* The new trigger */
  Table *pTab;            /* Table that the trigger fires off of */
  char *zName = 0;        /* Name of the trigger */
  sqlite3 *db = pParse->db;  /* The database connection */
  int iDb;                /* The database to store the trigger in */
  Token *pName;           /* The unqualified db name */
  DbFixer sFix;           /* State vector for the DB fixer */

  assert( pName1!=0 );   /* pName1->z might be NULL, but not pName1 itself */
  assert( pName2!=0 );
  assert( op==TK_INSERT || op==TK_UPDATE || op==TK_DELETE );
  assert( op>0 && op<0xff );
  if( isTemp ){
    /* If TEMP was specified, then the trigger name may not be qualified. */
    if( pName2->n>0 ){
      sqlite3ErrorMsg(pParse, "temporary trigger may not have qualified name");
      goto trigger_cleanup;
    }
    iDb = 1;
    pName = pName1;
  }else{
    /* Figure out the db that the trigger will be created in */
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ){
      goto trigger_cleanup;
    }
  }
  if( !pTableName || db->mallocFailed ){
    goto trigger_cleanup;
  }

  /* A long-standing parser bug is that this syntax was allowed:
  **
  **    CREATE TRIGGER attached.demo AFTER INSERT ON attached.tab ....
  **                                                 ^^^^^^^^
  **
  ** To maintain backwards compatibility, ignore the database
  ** name on pTableName if we are reparsing out of SQLITE_MASTER.
  */
  if( db->init.busy && iDb!=1 ){
    sqlite3DbFree(db, pTableName->a[0].zDatabase);
    pTableName->a[0].zDatabase = 0;
  }

  /* If the trigger name was unqualified, and the table is a temp table,
  ** then set iDb to 1 to create the trigger in the temporary database.
  ** If sqlite3SrcListLookup() returns 0, indicating the table does not
  ** exist, the error is caught by the block below.
  */
  pTab = sqlite3SrcListLookup(pParse, pTableName);
  if( db->init.busy==0 && pName2->n==0 && pTab
        && pTab->pSchema==db->aDb[1].pSchema ){
    iDb = 1;
  }

  /* Ensure the table name matches database name and that the table exists */
  if( db->mallocFailed ) goto trigger_cleanup;
  assert( pTableName->nSrc==1 );
  sqlite3FixInit(&sFix, pParse, iDb, "trigger", pName);
  if( sqlite3FixSrcList(&sFix, pTableName) ){
    goto trigger_cleanup;
  }
  pTab = sqlite3SrcListLookup(pParse, pTableName);
  if( !pTab ){
    /* The table does not exist. */
    if( db->init.iDb==1 ){
      /* Ticket #3810.
      ** Normally, whenever a table is dropped, all associated triggers are
      ** dropped too.  But if a TEMP trigger is created on a non-TEMP table
      ** and the table is dropped by a different database connection, the
      ** trigger is not visible to the database connection that does the
      ** drop so the trigger cannot be dropped.  This results in an
      ** "orphaned trigger" - a trigger whose associated table is missing.
      */
      db->init.orphanTrigger = 1;
    }
    goto trigger_cleanup;
  }
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "cannot create triggers on virtual tables");
    goto trigger_cleanup;
  }

  /* Check that the trigger name is not reserved and that no trigger of the
  ** specified name exists */
  zName = sqlite3NameFromToken(db, pName);
  if( !zName || SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
    goto trigger_cleanup;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  if( !IN_RENAME_OBJECT ){
    if( sqlite3HashFind(&(db->aDb[iDb].pSchema->trigHash),zName) ){
      if( !noErr ){
        sqlite3ErrorMsg(pParse, "trigger %T already exists", pName);
      }else{
        assert( !db->init.busy );
        sqlite3CodeVerifySchema(pParse, iDb);
      }
      goto trigger_cleanup;
    }
  }

  /* Do not create a trigger on a system table */
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 ){
    sqlite3ErrorMsg(pParse, "cannot create trigger on system table");
    goto trigger_cleanup;
  }

  /* INSTEAD of triggers are only for views and views only support INSTEAD
  ** of triggers.
  */
  if( pTab->pSelect && tr_tm!=TK_INSTEAD ){
    sqlite3ErrorMsg(pParse, "cannot create %s trigger on view: %S", 
        (tr_tm == TK_BEFORE)?"BEFORE":"AFTER", pTableName, 0);
    goto trigger_cleanup;
  }
  if( !pTab->pSelect && tr_tm==TK_INSTEAD ){
    sqlite3ErrorMsg(pParse, "cannot create INSTEAD OF"
        " trigger on table: %S", pTableName, 0);
    goto trigger_cleanup;
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( !IN_RENAME_OBJECT ){
    int iTabDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    int code = SQLITE_CREATE_TRIGGER;
    const char *zDb = db->aDb[iTabDb].zDbSName;
    const char *zDbTrig = isTemp ? db->aDb[1].zDbSName : zDb;
    if( iTabDb==1 || isTemp ) code = SQLITE_CREATE_TEMP_TRIGGER;
    if( sqlite3AuthCheck(pParse, code, zName, pTab->zName, zDbTrig) ){
      goto trigger_cleanup;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iTabDb),0,zDb)){
      goto trigger_cleanup;
    }
  }
#endif

  /* INSTEAD OF triggers can only appear on views and BEFORE triggers
  ** cannot appear on views.  So we might as well translate every
  ** INSTEAD OF trigger into a BEFORE trigger.  It simplifies code
  ** elsewhere.
  */
  if (tr_tm == TK_INSTEAD){
    tr_tm = TK_BEFORE;
  }

  /* Build the Trigger object */
  pTrigger = (Trigger*)sqlite3DbMallocZero(db, sizeof(Trigger));
  if( pTrigger==0 ) goto trigger_cleanup;
  pTrigger->zName = zName;
  zName = 0;
  pTrigger->table = sqlite3DbStrDup(db, pTableName->a[0].zName);
  pTrigger->pSchema = db->aDb[iDb].pSchema;
  pTrigger->pTabSchema = pTab->pSchema;
  pTrigger->op = (u8)op;
  pTrigger->tr_tm = tr_tm==TK_BEFORE ? TRIGGER_BEFORE : TRIGGER_AFTER;
  if( IN_RENAME_OBJECT ){
    sqlite3RenameTokenRemap(pParse, pTrigger->table, pTableName->a[0].zName);
    pTrigger->pWhen = pWhen;
    pWhen = 0;
  }else{
    pTrigger->pWhen = sqlite3ExprDup(db, pWhen, EXPRDUP_REDUCE);
  }
  pTrigger->pColumns = pColumns;
  pColumns = 0;
  assert( pParse->pNewTrigger==0 );
  pParse->pNewTrigger = pTrigger;

trigger_cleanup:
  sqlite3DbFree(db, zName);
  sqlite3SrcListDelete(db, pTableName);
  sqlite3IdListDelete(db, pColumns);
  sqlite3ExprDelete(db, pWhen);
  if( !pParse->pNewTrigger ){
    sqlite3DeleteTrigger(db, pTrigger);
  }else{
    assert( pParse->pNewTrigger==pTrigger );
  }
}